

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

bool __thiscall Ptex::v2_2::PtexReader::tryClose(PtexReader *this)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->_fp != (Handle)0x0) {
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&this->readlock);
    if (iVar1 == 0) {
      closeFP(this);
      pthread_mutex_unlock((pthread_mutex_t *)&this->readlock);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool PtexReader::tryClose()
{
    if (_fp) {
        if (!readlock.trylock()) return false;
        closeFP();
        readlock.unlock();
    }
    return true;
}